

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_16(QPDF *pdf,char *arg2)

{
  char cVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  long lVar4;
  QPDFObjectHandle QVar5;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0 [3];
  allocator<char> local_91;
  QPDFObjectHandle page;
  allocator<char> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFObjectHandle pages;
  QPDFObjectHandle kids;
  QPDFObjectHandle root;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  QPDFObjectHandle contents;
  unsigned_long local_20;
  
  cVar1 = QPDF::everCalledGetAllPages();
  if (cVar1 != '\0') {
    __assert_fail("!pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x2e9,"void test_16(QPDF &, const char *)");
  }
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  cVar1 = QPDF::everCalledGetAllPages();
  if (cVar1 == '\0') {
    __assert_fail("pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x2eb,"void test_16(QPDF &, const char *)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 10",(allocator<char> *)&page);
  createPageContents((QPDF *)&contents,(string *)pdf);
  std::__cxx11::string::~string((string *)&w);
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w,p_Var2);
  QPDFObjectHandle::shallowCopy();
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&page;
  QPDF::makeIndirectObject(QVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Contents",(allocator<char> *)&root);
  QPDFObjectHandle::replaceKey((string *)&page,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Pages",(allocator<char> *)&kids)
  ;
  QPDFObjectHandle::getKey((string *)&pages);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Kids",local_80);
  QPDFObjectHandle::getKey((string *)&kids);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Parent",local_80);
  QPDFObjectHandle::replaceKey((string *)&page,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Count",&local_91);
  local_20 = (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_20);
  QPDFObjectHandle::newInteger((longlong)local_80);
  QPDFObjectHandle::replaceKey((string *)&pages,(QPDFObjectHandle *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__cxx11::string::~string((string *)&w);
  QPDFObjectHandle::appendItem(&kids);
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start != 0xa0) {
    __assert_fail("all_pages.size() == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x2f9,"void test_16(QPDF &, const char *)");
  }
  QPDF::updateAllPagesCache();
  cVar1 = QPDF::everCalledGetAllPages();
  if (cVar1 != '\0') {
    if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start != 0xb0) {
      __assert_fail("all_pages.size() == 11",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x2fc,"void test_16(QPDF &, const char *)");
    }
    lVar3 = QPDFObjectHandle::getObjGen();
    lVar4 = QPDFObjectHandle::getObjGen();
    if (lVar3 == lVar4) {
      QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
      QPDFWriter::setStaticID(SUB81(&w,0));
      QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
      QPDFWriter::write();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pages.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&root.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&contents.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assert_fail("all_pages.back().getObjGen() == page.getObjGen()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x2fd,"void test_16(QPDF &, const char *)");
  }
  __assert_fail("pdf.everCalledGetAllPages()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x2fb,"void test_16(QPDF &, const char *)");
}

Assistant:

static void
test_16(QPDF& pdf, char const* arg2)
{
    // Insert a page manually and then update the cache.
    assert(!pdf.everCalledGetAllPages());
    std::vector<QPDFObjectHandle> const& all_pages = pdf.getAllPages();
    assert(pdf.everCalledGetAllPages());

    QPDFObjectHandle contents = createPageContents(pdf, "New page 10");
    QPDFObjectHandle page = pdf.makeIndirectObject(QPDFObjectHandle(all_pages.at(0)).shallowCopy());
    page.replaceKey("/Contents", contents);

    // Insert the page manually.
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    page.replaceKey("/Parent", pages);
    pages.replaceKey(
        "/Count", QPDFObjectHandle::newInteger(1 + QIntC::to_longlong(all_pages.size())));
    kids.appendItem(page);
    assert(all_pages.size() == 10);
    pdf.updateAllPagesCache();
    assert(pdf.everCalledGetAllPages());
    assert(all_pages.size() == 11);
    assert(all_pages.back().getObjGen() == page.getObjGen());

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}